

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O1

Value * __thiscall
anon_unknown.dwarf_f33f06::ResolvePath(anon_unknown_dwarf_f33f06 *this,Value *json,Args path)

{
  ptrdiff_t *ppVar1;
  bool bVar2;
  ArrayIndex max;
  int index;
  ValueType type;
  runtime_error *prVar3;
  Value *args_1;
  string_view separator;
  string_view separator_00;
  Args progress;
  string progressStr;
  Args local_c8;
  _Storage<(anonymous_namespace)::Args,_true> local_b8;
  undefined1 local_a8;
  static_string_view local_90;
  static_string_view local_80;
  string local_70;
  static_string_view local_50;
  string_view local_40;
  
  if (json != (Value *)path.
                       super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .Begin._M_current._M_current) {
    args_1 = json;
    do {
      ppVar1 = &args_1->limit_;
      local_c8.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .Begin._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)json;
      local_c8.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .End._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppVar1;
      bVar2 = Json::Value::isArray((Value *)this);
      if (bVar2) {
        local_b8._M_value.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .Begin._M_current =
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )local_c8.
                 super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 .Begin._M_current;
        local_b8._M_value.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .End._M_current =
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )local_c8.
                 super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 .End._M_current;
        local_a8 = 1;
        max = Json::Value::size((Value *)this);
        index = ParseIndex((string *)args_1,
                           (optional<(anonymous_namespace)::Args> *)&local_b8._M_value,max);
        this = (anon_unknown_dwarf_f33f06 *)Json::Value::operator[]((Value *)this,index);
      }
      else {
        bVar2 = Json::Value::isObject((Value *)this);
        if (!bVar2) {
          separator_00._M_str = " ";
          separator_00._M_len = 1;
          cmJoin<(anonymous_namespace)::Args>((string *)&local_b8._M_value,&local_c8,separator_00);
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x28);
          local_80.super_string_view._M_len = 0xe;
          local_80.super_string_view._M_str = "invalid path \'";
          local_90.super_string_view._M_len = 0x33;
          local_90.super_string_view._M_str =
               "\', need element of OBJECT or ARRAY type to lookup \'";
          local_50.super_string_view._M_len = 6;
          local_50.super_string_view._M_str = "\' got ";
          type = Json::Value::type((Value *)this);
          local_40 = JsonTypeToString(type);
          cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>
                    (&local_70,&local_80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_b8._M_value,&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,
                     &local_50,&local_40);
          std::runtime_error::runtime_error(prVar3,(string *)&local_70);
          *(undefined ***)prVar3 = &PTR__runtime_error_00a53ea8;
          *(undefined4 *)(prVar3 + 0x10) =
               local_c8.
               super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .Begin._M_current._0_4_;
          *(undefined4 *)(prVar3 + 0x14) =
               local_c8.
               super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .Begin._M_current._4_4_;
          *(undefined4 *)(prVar3 + 0x18) =
               local_c8.
               super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .End._M_current._0_4_;
          *(undefined4 *)(prVar3 + 0x1c) =
               local_c8.
               super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .End._M_current._4_4_;
          prVar3[0x20] = (runtime_error)0x1;
          __cxa_throw(prVar3,&(anonymous_namespace)::json_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        bVar2 = Json::Value::isMember((Value *)this,(String *)args_1);
        if (!bVar2) {
          separator._M_str = " ";
          separator._M_len = 1;
          cmJoin<(anonymous_namespace)::Args>((string *)&local_b8._M_value,&local_c8,separator);
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x28);
          local_80.super_string_view._M_len = 8;
          local_80.super_string_view._M_str = "member \'";
          local_90.super_string_view._M_len = 0xb;
          local_90.super_string_view._M_str = "\' not found";
          cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view>
                    (&local_70,&local_80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_b8._M_value,&local_90);
          std::runtime_error::runtime_error(prVar3,(string *)&local_70);
          *(undefined ***)prVar3 = &PTR__runtime_error_00a53ea8;
          *(undefined4 *)(prVar3 + 0x10) =
               local_c8.
               super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .Begin._M_current._0_4_;
          *(undefined4 *)(prVar3 + 0x14) =
               local_c8.
               super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .Begin._M_current._4_4_;
          *(undefined4 *)(prVar3 + 0x18) =
               local_c8.
               super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .End._M_current._0_4_;
          *(undefined4 *)(prVar3 + 0x1c) =
               local_c8.
               super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .End._M_current._4_4_;
          prVar3[0x20] = (runtime_error)0x1;
          __cxa_throw(prVar3,&(anonymous_namespace)::json_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        this = (anon_unknown_dwarf_f33f06 *)Json::Value::operator[]((Value *)this,(String *)args_1);
      }
      args_1 = (Value *)ppVar1;
    } while ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppVar1 !=
             path.
             super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .Begin._M_current._M_current);
  }
  return (Value *)this;
}

Assistant:

Json::Value& ResolvePath(Json::Value& json, Args path)
{
  Json::Value* search = &json;

  for (auto curr = path.begin(); curr != path.end(); ++curr) {
    const std::string& field = *curr;
    Args progress{ path.begin(), curr + 1 };

    if (search->isArray()) {
      auto index = ParseIndex(field, progress, search->size());
      search = &(*search)[index];

    } else if (search->isObject()) {
      if (!search->isMember(field)) {
        const auto progressStr = cmJoin(progress, " "_s);
        throw json_error(cmStrCat("member '"_s, progressStr, "' not found"_s),
                         progress);
      }
      search = &(*search)[field];
    } else {
      const auto progressStr = cmJoin(progress, " "_s);
      throw json_error(
        cmStrCat("invalid path '"_s, progressStr,
                 "', need element of OBJECT or ARRAY type to lookup '"_s,
                 field, "' got "_s, JsonTypeToString(search->type())),
        progress);
    }
  }
  return *search;
}